

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void __thiscall CaDiCaL::Options::print(Options *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar120;
  int iVar121;
  int iVar122;
  int iVar123;
  int iVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  int iVar128;
  int iVar129;
  int iVar130;
  int iVar131;
  int iVar132;
  int iVar133;
  int iVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  int iVar145;
  int iVar146;
  int iVar147;
  int iVar148;
  int iVar149;
  int iVar150;
  int iVar151;
  int iVar152;
  int iVar153;
  int iVar154;
  int iVar155;
  int iVar156;
  char *pcVar157;
  char *pcVar158;
  char *pcVar159;
  char *pcVar160;
  uint uVar161;
  int iVar162;
  char *pcVar163;
  char *pcVar164;
  char *pcVar165;
  int iVar166;
  bool bVar167;
  bool bVar168;
  char buffer [256];
  
  iVar166 = this->arena;
  if (iVar166 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar166 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--arena=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->arena == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar162 = this->arenacompact;
  uVar161 = (iVar166 != 1) + 1;
  if (iVar162 == 1) {
    uVar161 = (uint)(iVar166 != 1);
  }
  if (this->verbose != 0 || iVar162 != 1) {
    pcVar157 = "false";
    if (iVar162 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--arenacompact=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->arenacompact == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar166 = this->arenasort;
  if (iVar166 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar166 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--arenasort=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->arenasort == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar162 = this->arenatype;
  if (iVar162 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--arenatype=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->arenatype == 3) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar1 = this->binary;
  if (iVar1 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar1 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--binary=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->binary == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar2 = this->block;
  if (this->verbose != 0 || iVar2 != 0) {
    pcVar157 = "true";
    if (iVar2 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--block=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->block == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar3 = this->blockmaxclslim;
  if (iVar3 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--blockmaxclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->blockmaxclslim == 100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar4 = this->blockminclslim;
  if (iVar4 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--blockminclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->blockminclslim == 2) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar5 = this->blockocclim;
  if (iVar5 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--blockocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->blockocclim == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar6 = this->bump;
  if (iVar6 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar6 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--bump=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->bump == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar7 = this->bumpreason;
  if (iVar7 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar7 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--bumpreason=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->bumpreason == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar8 = this->bumpreasondepth;
  if (iVar8 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--bumpreasondepth=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->bumpreasondepth == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar9 = this->check;
  if (this->verbose != 0 || iVar9 != 0) {
    pcVar157 = "true";
    if (iVar9 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--check=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->check == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar10 = this->checkassumptions;
  if (iVar10 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar10 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--checkassumptions=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->checkassumptions == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar11 = this->checkconstraint;
  if (iVar11 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar11 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--checkconstraint=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->checkconstraint == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar12 = this->checkfailed;
  if (iVar12 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar12 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--checkfailed=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->checkfailed == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar13 = this->checkfrozen;
  if (this->verbose != 0 || iVar13 != 0) {
    pcVar157 = "true";
    if (iVar13 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--checkfrozen=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->checkfrozen == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar14 = this->checkproof;
  if (iVar14 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--checkproof=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->checkproof == 3) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar15 = this->checkwitness;
  if (iVar15 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar15 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--checkwitness=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->checkwitness == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar16 = this->chrono;
  if (iVar16 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--chrono=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->chrono == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar17 = this->chronoalways;
  if (this->verbose != 0 || iVar17 != 0) {
    pcVar157 = "true";
    if (iVar17 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--chronoalways=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->chronoalways == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar18 = this->chronolevelim;
  if (iVar18 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--chronolevelim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->chronolevelim == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar19 = this->chronoreusetrail;
  if (iVar19 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar19 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--chronoreusetrail=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->chronoreusetrail == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar20 = this->compact;
  if (iVar20 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar20 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--compact=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->compact == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar21 = this->compactint;
  if (iVar21 != 2000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--compactint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->compactint == 2000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e3\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar22 = this->compactlim;
  if (iVar22 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--compactlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->compactlim == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar23 = this->compactmin;
  if (iVar23 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--compactmin=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->compactmin == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar24 = this->condition;
  if (this->verbose != 0 || iVar24 != 0) {
    pcVar157 = "true";
    if (iVar24 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--condition=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->condition == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar25 = this->conditionint;
  if (iVar25 != 10000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->conditionint == 10000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e4\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar26 = this->conditionmaxeff;
  if (iVar26 != 10000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionmaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->conditionmaxeff == 10000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e7\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar27 = this->conditionmaxrat;
  if (iVar27 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionmaxrat=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->conditionmaxrat == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'100\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar28 = this->conditionmineff;
  if (iVar28 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionmineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->conditionmineff == 1000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar29 = this->conditionreleff;
  if (iVar29 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->conditionreleff == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'100\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar30 = this->cover;
  if (this->verbose != 0 || iVar30 != 0) {
    pcVar157 = "true";
    if (iVar30 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--cover=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->cover == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar31 = this->covermaxclslim;
  if (iVar31 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--covermaxclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->covermaxclslim == 100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar32 = this->covermaxeff;
  if (iVar32 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--covermaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->covermaxeff == 100000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar33 = this->coverminclslim;
  if (iVar33 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--coverminclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->coverminclslim == 2) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar34 = this->covermineff;
  if (iVar34 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--covermineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->covermineff == 1000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar35 = this->coverreleff;
  if (iVar35 != 4 || this->verbose != 0) {
    snprintf(buffer,0x100,"--coverreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->coverreleff == 4) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'4\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar36 = this->decompose;
  if (iVar36 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar36 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--decompose=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->decompose == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar37 = this->decomposerounds;
  if (iVar37 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--decomposerounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->decomposerounds == 2) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar38 = this->deduplicate;
  if (iVar38 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar38 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--deduplicate=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->deduplicate == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar39 = this->eagersubsume;
  if (iVar39 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar39 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--eagersubsume=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->eagersubsume == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar40 = this->eagersubsumelim;
  if (iVar40 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--eagersubsumelim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->eagersubsumelim == 0x14) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar41 = this->elim;
  if (iVar41 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar41 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--elim=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elim == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar42 = this->elimands;
  if (iVar42 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar42 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--elimands=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimands == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar43 = this->elimaxeff;
  if (iVar43 != 2000000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimaxeff == 2000000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e9\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar44 = this->elimbackward;
  if (iVar44 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar44 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--elimbackward=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimbackward == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar45 = this->elimboundmax;
  if (iVar45 != 0x10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimboundmax=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimboundmax == 0x10) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'16\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar46 = this->elimboundmin;
  if (this->verbose != 0 || iVar46 != 0) {
    snprintf(buffer,0x100,"--elimboundmin=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimboundmin == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar158,buffer,pcVar160
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar47 = this->elimclslim;
  if (iVar47 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimclslim == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar48 = this->elimequivs;
  if (iVar48 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar48 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--elimequivs=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimequivs == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar49 = this->elimineff;
  if (iVar49 != 10000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimineff == 10000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e7\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar50 = this->elimint;
  if (iVar50 != 2000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimint == 2000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e3\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar51 = this->elimites;
  if (iVar51 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar51 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--elimites=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimites == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar52 = this->elimlimited;
  if (iVar52 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar52 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--elimlimited=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimlimited == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar53 = this->elimocclim;
  if (iVar53 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimocclim == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar54 = this->elimprod;
  if (iVar54 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimprod=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimprod == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar55 = this->elimreleff;
  if (iVar55 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimreleff == 1000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar56 = this->elimrounds;
  if (iVar56 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimrounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimrounds == 2) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar57 = this->elimsubst;
  if (iVar57 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar57 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--elimsubst=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimsubst == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar58 = this->elimsum;
  if (iVar58 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimsum=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimsum == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar59 = this->elimxorlim;
  if (iVar59 != 5 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimxorlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimxorlim == 5) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'5\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar60 = this->elimxors;
  if (iVar60 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar60 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--elimxors=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->elimxors == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar61 = this->emagluefast;
  if (iVar61 != 0x21 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emagluefast=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->emagluefast == 0x21) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'33\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar62 = this->emaglueslow;
  if (iVar62 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emaglueslow=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->emaglueslow == 100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar63 = this->emajump;
  if (iVar63 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emajump=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->emajump == 100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar64 = this->emalevel;
  if (iVar64 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emalevel=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->emalevel == 100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar65 = this->emasize;
  if (iVar65 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emasize=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->emasize == 100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar66 = this->ematrailfast;
  if (iVar66 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ematrailfast=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ematrailfast == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar67 = this->ematrailslow;
  if (iVar67 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ematrailslow=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ematrailslow == 100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar68 = this->exteagerreasons;
  if (iVar68 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar68 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--exteagerreasons=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->exteagerreasons == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar69 = this->exteagerrecalc;
  if (iVar69 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar69 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--exteagerrecalc=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->exteagerrecalc == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar70 = this->externallrat;
  if (this->verbose != 0 || iVar70 != 0) {
    pcVar157 = "true";
    if (iVar70 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--externallrat=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->externallrat == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar71 = this->flush;
  if (this->verbose != 0 || iVar71 != 0) {
    pcVar157 = "true";
    if (iVar71 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--flush=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->flush == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar72 = this->flushfactor;
  if (iVar72 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--flushfactor=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->flushfactor == 3) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar73 = this->flushint;
  if (iVar73 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--flushint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->flushint == 100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar74 = this->forcephase;
  if (this->verbose != 0 || iVar74 != 0) {
    pcVar157 = "true";
    if (iVar74 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--forcephase=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->forcephase == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar75 = this->frat;
  if (this->verbose != 0 || iVar75 != 0) {
    snprintf(buffer,0x100,"--frat=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->frat == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar158,buffer,pcVar160
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar76 = this->idrup;
  if (this->verbose != 0 || iVar76 != 0) {
    pcVar157 = "true";
    if (iVar76 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--idrup=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->idrup == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar77 = this->ilb;
  if (this->verbose != 0 || iVar77 != 0) {
    pcVar157 = "true";
    if (iVar77 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--ilb=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ilb == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar78 = this->ilbassumptions;
  if (this->verbose != 0 || iVar78 != 0) {
    pcVar157 = "true";
    if (iVar78 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--ilbassumptions=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ilbassumptions == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar79 = this->inprocessing;
  if (iVar79 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar79 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--inprocessing=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->inprocessing == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar80 = this->instantiate;
  if (this->verbose != 0 || iVar80 != 0) {
    pcVar157 = "true";
    if (iVar80 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--instantiate=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->instantiate == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar81 = this->instantiateclslim;
  if (iVar81 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--instantiateclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->instantiateclslim == 3) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar82 = this->instantiateocclim;
  if (iVar82 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--instantiateocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->instantiateocclim == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar83 = this->instantiateonce;
  if (iVar83 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar83 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--instantiateonce=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->instantiateonce == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar84 = this->lidrup;
  if (this->verbose != 0 || iVar84 != 0) {
    pcVar157 = "true";
    if (iVar84 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--lidrup=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->lidrup == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar85 = this->lrat;
  if (this->verbose != 0 || iVar85 != 0) {
    pcVar157 = "true";
    if (iVar85 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--lrat=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->lrat == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar86 = this->lucky;
  if (iVar86 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar86 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--lucky=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->lucky == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar87 = this->minimize;
  if (iVar87 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar87 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--minimize=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->minimize == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar88 = this->minimizedepth;
  if (iVar88 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--minimizedepth=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->minimizedepth == 1000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar89 = this->otfs;
  if (iVar89 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar89 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--otfs=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->otfs == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar90 = this->phase;
  if (iVar90 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar90 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--phase=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->phase == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar91 = this->probe;
  if (iVar91 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar91 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--probe=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->probe == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar92 = this->probehbr;
  if (iVar92 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar92 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--probehbr=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->probehbr == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar93 = this->probeint;
  if (iVar93 != 5000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probeint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->probeint == 5000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'5e3\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar94 = this->probemaxeff;
  if (iVar94 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probemaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->probemaxeff == 100000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar95 = this->probemineff;
  if (iVar95 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probemineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->probemineff == 1000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar96 = this->probereleff;
  if (iVar96 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probereleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->probereleff == 0x14) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar97 = this->proberounds;
  if (iVar97 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--proberounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->proberounds == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar98 = this->profile;
  if (iVar98 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--profile=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->profile == 2) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar99 = this->quiet;
  if (this->verbose != 0 || iVar99 != 0) {
    pcVar157 = "true";
    if (iVar99 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--quiet=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->quiet == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar100 = this->radixsortlim;
  if (iVar100 != 0x20 || this->verbose != 0) {
    snprintf(buffer,0x100,"--radixsortlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->radixsortlim == 0x20) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'32\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar101 = this->realtime;
  if (this->verbose != 0 || iVar101 != 0) {
    pcVar157 = "true";
    if (iVar101 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--realtime=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->realtime == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar102 = this->reduce;
  if (iVar102 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar102 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--reduce=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reduce == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar103 = this->reduceint;
  if (iVar103 != 300 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reduceint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reduceint == 300) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'300\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar104 = this->reducetarget;
  if (iVar104 != 0x4b || this->verbose != 0) {
    snprintf(buffer,0x100,"--reducetarget=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reducetarget == 0x4b) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'75\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar105 = this->reducetier1glue;
  if (iVar105 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reducetier1glue=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reducetier1glue == 2) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar106 = this->reducetier2glue;
  if (iVar106 != 6 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reducetier2glue=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reducetier2glue == 6) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'6\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar107 = this->reluctant;
  if (iVar107 != 0x400 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reluctant=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reluctant == 0x400) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1024\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar108 = this->reluctantmax;
  if (iVar108 != 0x100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reluctantmax=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reluctantmax == 0x100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1048576\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar109 = this->rephase;
  if (iVar109 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar109 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--rephase=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->rephase == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar110 = this->rephaseint;
  if (iVar110 == 1000 && this->verbose == 0) {
    bVar167 = false;
  }
  else {
    snprintf(buffer,0x100,"--rephaseint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->rephaseint == 1000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
    bVar167 = this->verbose != 0;
  }
  iVar111 = this->report;
  bVar168 = iVar111 != reportdefault;
  if (bVar168 || bVar167) {
    pcVar160 = "true";
    pcVar157 = "true";
    if (iVar111 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--report=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->report == reportdefault) {
        pcVar164 = "same as";
        pcVar163 = "\x1b[0;32m";
        pcVar159 = "";
        pcVar158 = "";
      }
      else {
        pcVar159 = "";
        if (tout[9] != '\0') {
          pcVar159 = "\x1b[1;33m";
        }
        pcVar164 = "different from";
        pcVar163 = "\x1b[0;33m";
        pcVar158 = pcVar157;
      }
      pcVar165 = "";
      if (tout[9] != '\0') {
        pcVar165 = pcVar163;
      }
      if (reportdefault == 0) {
        pcVar160 = "false";
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar159,buffer,
                        pcVar158,pcVar164,pcVar165,pcVar160,pcVar157);
    }
  }
  iVar111 = this->reportall;
  if (this->verbose != 0 || iVar111 != 0) {
    pcVar157 = "true";
    if (iVar111 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--reportall=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reportall == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar112 = this->reportsolve;
  if (this->verbose != 0 || iVar112 != 0) {
    pcVar157 = "true";
    if (iVar112 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--reportsolve=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reportsolve == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar113 = this->restart;
  if (iVar113 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar113 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--restart=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->restart == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar114 = this->restartint;
  if (iVar114 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--restartint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->restartint == 2) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar115 = this->restartmargin;
  if (iVar115 != 10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--restartmargin=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->restartmargin == 10) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'10\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar116 = this->restartreusetrail;
  if (iVar116 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar116 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--restartreusetrail=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->restartreusetrail == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar117 = this->restoreall;
  if (this->verbose != 0 || iVar117 != 0) {
    snprintf(buffer,0x100,"--restoreall=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->restoreall == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar158,buffer,pcVar160
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar118 = this->restoreflush;
  if (this->verbose != 0 || iVar118 != 0) {
    pcVar157 = "true";
    if (iVar118 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--restoreflush=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->restoreflush == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar119 = this->reverse;
  if (this->verbose != 0 || iVar119 != 0) {
    pcVar157 = "true";
    if (iVar119 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--reverse=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->reverse == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar120 = this->score;
  if (iVar120 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar120 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--score=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->score == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar121 = this->scorefactor;
  if (iVar121 != 0x3b6 || this->verbose != 0) {
    snprintf(buffer,0x100,"--scorefactor=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->scorefactor == 0x3b6) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'950\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar122 = this->seed;
  if (this->verbose != 0 || iVar122 != 0) {
    snprintf(buffer,0x100,"--seed=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->seed == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar158,buffer,pcVar160
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar123 = this->shrink;
  if (iVar123 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--shrink=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->shrink == 3) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar124 = this->shrinkreap;
  if (iVar124 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar124 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--shrinkreap=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->shrinkreap == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar125 = this->shuffle;
  if (this->verbose != 0 || iVar125 != 0) {
    pcVar157 = "true";
    if (iVar125 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--shuffle=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->shuffle == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar126 = this->shufflequeue;
  if (iVar126 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar126 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--shufflequeue=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->shufflequeue == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar127 = this->shufflerandom;
  if (this->verbose != 0 || iVar127 != 0) {
    pcVar157 = "true";
    if (iVar127 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--shufflerandom=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->shufflerandom == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar128 = this->shufflescores;
  if (iVar128 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar128 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--shufflescores=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->shufflescores == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar129 = this->stabilize;
  if (iVar129 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar129 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--stabilize=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->stabilize == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar130 = this->stabilizefactor;
  if (iVar130 != 200 || this->verbose != 0) {
    snprintf(buffer,0x100,"--stabilizefactor=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->stabilizefactor == 200) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'200\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar131 = this->stabilizeint;
  if (iVar131 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--stabilizeint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->stabilizeint == 1000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar132 = this->stabilizemaxint;
  if (iVar132 != 2000000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--stabilizemaxint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->stabilizemaxint == 2000000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e9\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar133 = this->stabilizeonly;
  if (this->verbose != 0 || iVar133 != 0) {
    pcVar157 = "true";
    if (iVar133 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--stabilizeonly=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->stabilizeonly == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar134 = this->stats;
  if (this->verbose != 0 || iVar134 != 0) {
    pcVar157 = "true";
    if (iVar134 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--stats=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->stats == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar135 = this->subsume;
  if (iVar135 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar135 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--subsume=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsume == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar136 = this->subsumebinlim;
  if (iVar136 != 10000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumebinlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsumebinlim == 10000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e4\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar137 = this->subsumeclslim;
  if (iVar137 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumeclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsumeclslim == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar138 = this->subsumeint;
  if (iVar138 != 10000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumeint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsumeint == 10000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e4\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar139 = this->subsumelimited;
  if (iVar139 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar139 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--subsumelimited=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsumelimited == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar140 = this->subsumemaxeff;
  if (iVar140 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumemaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsumemaxeff == 100000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar141 = this->subsumemineff;
  if (iVar141 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumemineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsumemineff == 1000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar142 = this->subsumeocclim;
  if (iVar142 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumeocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsumeocclim == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar143 = this->subsumereleff;
  if (iVar143 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumereleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsumereleff == 1000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar144 = this->subsumestr;
  if (iVar144 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar144 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--subsumestr=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->subsumestr == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar145 = this->target;
  if (iVar145 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--target=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->target == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar146 = this->terminateint;
  if (iVar146 != 10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--terminateint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->terminateint == 10) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'10\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar147 = this->ternary;
  if (iVar147 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar147 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--ternary=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ternary == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar148 = this->ternarymaxadd;
  if (iVar148 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternarymaxadd=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ternarymaxadd == 1000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar149 = this->ternarymaxeff;
  if (iVar149 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternarymaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ternarymaxeff == 100000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar150 = this->ternarymineff;
  if (iVar150 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternarymineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ternarymineff == 1000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar151 = this->ternaryocclim;
  if (iVar151 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternaryocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ternaryocclim == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar152 = this->ternaryreleff;
  if (iVar152 != 10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternaryreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ternaryreleff == 10) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'10\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar153 = this->ternaryrounds;
  if (iVar153 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternaryrounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->ternaryrounds == 2) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar160,buffer,pcVar159
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar154 = this->transred;
  if (iVar154 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar154 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--transred=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->transred == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar155 = this->transredmaxeff;
  if (iVar155 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--transredmaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->transredmaxeff == 100000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar156 = this->transredmineff;
  if (iVar156 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--transredmineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->transredmineff == 1000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar162 = ((((((((((((((((((((((((((((((((((((((((((((((((uVar161 + (iVar166 != 1) +
                                                            (uint)(iVar162 != 3) +
                                                           (uint)(iVar1 != 1)) - (uint)(iVar2 == 0))
                                                          + (uint)(iVar3 != 100000) +
                                                          (uint)(iVar4 != 2) + (uint)(iVar5 != 100)
                                                          + (uint)(iVar6 != 1) + (uint)(iVar7 != 1)
                                                         + (uint)(iVar8 != 1)) - (uint)(iVar9 == 0))
                                                        + (uint)(iVar10 != 1) + (uint)(iVar11 != 1)
                                                       + (uint)(iVar12 != 1)) - (uint)(iVar13 == 0))
                                                      + (uint)(iVar14 != 3) + (uint)(iVar15 != 1) +
                                                     (uint)(iVar16 != 1)) - (uint)(iVar17 == 0)) +
                                                    (uint)(iVar18 != 100) + (uint)(iVar19 != 1) +
                                                    (uint)(iVar20 != 1) + (uint)(iVar21 != 2000) +
                                                    (uint)(iVar22 != 100) + (uint)(iVar23 != 100)) -
                                                  (uint)(iVar24 == 0)) + (uint)(iVar25 != 10000) +
                                                  (uint)(iVar26 != 10000000) + (uint)(iVar27 != 100)
                                                  + (uint)(iVar28 != 1000000) +
                                                 (uint)(iVar29 != 100)) - (uint)(iVar30 == 0)) +
                                                (uint)(iVar31 != 100000) +
                                                (uint)(iVar32 != 100000000) + (uint)(iVar33 != 2) +
                                                (uint)(iVar34 != 1000000) + (uint)(iVar35 != 4) +
                                                (uint)(iVar36 != 1) + (uint)(iVar37 != 2) +
                                                (uint)(iVar38 != 1) + (uint)(iVar39 != 1) +
                                                (uint)(iVar40 != 0x14) + (uint)(iVar41 != 1) +
                                                (uint)(iVar42 != 1) + (uint)(iVar43 != 2000000000) +
                                                (uint)(iVar44 != 1) + (uint)(iVar45 != 0x10)) -
                                              (uint)(iVar46 == 0)) + (uint)(iVar47 != 100) +
                                              (uint)(iVar48 != 1) + (uint)(iVar49 != 10000000) +
                                              (uint)(iVar50 != 2000) + (uint)(iVar51 != 1) +
                                              (uint)(iVar52 != 1) + (uint)(iVar53 != 100) +
                                              (uint)(iVar54 != 1) + (uint)(iVar55 != 1000) +
                                              (uint)(iVar56 != 2) + (uint)(iVar57 != 1) +
                                              (uint)(iVar58 != 1) + (uint)(iVar59 != 5) +
                                              (uint)(iVar60 != 1) + (uint)(iVar61 != 0x21) +
                                              (uint)(iVar62 != 100000) + (uint)(iVar63 != 100000) +
                                              (uint)(iVar64 != 100000) + (uint)(iVar65 != 100000) +
                                              (uint)(iVar66 != 100) + (uint)(iVar67 != 100000) +
                                              (uint)(iVar68 != 1) + (uint)(iVar69 != 1)) -
                                            (uint)(iVar70 == 0)) - (uint)(iVar71 == 0)) +
                                           (uint)(iVar72 != 3) + (uint)(iVar73 != 100000)) -
                                         (uint)(iVar74 == 0)) - (uint)(iVar75 == 0)) -
                                       (uint)(iVar76 == 0)) - (uint)(iVar77 == 0)) -
                                     (uint)(iVar78 == 0)) + (uint)(iVar79 != 1)) -
                                   (uint)(iVar80 == 0)) + (uint)(iVar81 != 3) + (uint)(iVar82 != 1)
                                  + (uint)(iVar83 != 1)) - (uint)(iVar84 == 0)) -
                                (uint)(iVar85 == 0)) + (uint)(iVar86 != 1) + (uint)(iVar87 != 1) +
                                (uint)(iVar88 != 1000) + (uint)(iVar89 != 1) + (uint)(iVar90 != 1) +
                                (uint)(iVar91 != 1) + (uint)(iVar92 != 1) + (uint)(iVar93 != 5000) +
                                (uint)(iVar94 != 100000000) + (uint)(iVar95 != 1000000) +
                                (uint)(iVar96 != 0x14) + (uint)(iVar97 != 1) + (uint)(iVar98 != 2))
                              - (uint)(iVar99 == 0)) + (uint)(iVar100 != 0x20)) -
                            (uint)(iVar101 == 0)) + (uint)(iVar102 != 1) + (uint)(iVar103 != 300) +
                            (uint)(iVar104 != 0x4b) + (uint)(iVar105 != 2) + (uint)(iVar106 != 6) +
                            (uint)(iVar107 != 0x400) + (uint)(iVar108 != 0x100000) +
                            (uint)(iVar109 != 1) + (uint)(iVar110 != 1000) + (uint)bVar168) -
                          (uint)(iVar111 == 0)) - (uint)(iVar112 == 0)) + (uint)(iVar113 != 1) +
                         (uint)(iVar114 != 2) + (uint)(iVar115 != 10) + (uint)(iVar116 != 1)) -
                       (uint)(iVar117 == 0)) - (uint)(iVar118 == 0)) - (uint)(iVar119 == 0)) +
                     (uint)(iVar120 != 1) + (uint)(iVar121 != 0x3b6)) - (uint)(iVar122 == 0)) +
                   (uint)(iVar123 != 3) + (uint)(iVar124 != 1) + 0x1d) - (uint)(iVar125 == 0)) +
                (uint)(iVar126 != 1)) - (uint)(iVar127 == 0)) + (uint)(iVar128 != 1) +
               (uint)(iVar129 != 1) + (uint)(iVar130 != 200) + (uint)(iVar131 != 1000) +
              (uint)(iVar132 != 2000000000)) - (uint)(iVar133 == 0)) - (uint)(iVar134 == 0)) +
            (uint)(iVar135 != 1) + (uint)(iVar136 != 10000) + (uint)(iVar137 != 100) +
            (uint)(iVar138 != 10000) + (uint)(iVar139 != 1) + (uint)(iVar140 != 100000000) +
            (uint)(iVar141 != 1000000) + (uint)(iVar142 != 100) + (uint)(iVar143 != 1000) +
            (uint)(iVar144 != 1) + (uint)(iVar145 != 1) + (uint)(iVar146 != 10) +
            (uint)(iVar147 != 1) + (uint)(iVar148 != 1000) + (uint)(iVar149 != 100000000) +
            (uint)(iVar150 != 1000000) + (uint)(iVar151 != 100) + (uint)(iVar152 != 10) +
            (uint)(iVar153 != 2) + (uint)(iVar154 != 1) + (uint)(iVar155 != 100000000) +
            (uint)(iVar156 != 1000000) + (uint)(this->transredreleff != 100);
  iVar166 = 0;
  if (this->transredreleff != 100 || this->verbose != 0) {
    iVar166 = 0;
    snprintf(buffer,0x100,"--transredreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->transredreleff == 100) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
    if (this->verbose != 0) {
      iVar162 = iVar162 + 1;
      snprintf(buffer,0x100,"--verbose=%d");
      iVar166 = this->verbose;
      if (this->internal != (Internal *)0x0) {
        pcVar157 = "\x1b[0m";
        if (tout[9] == '\0') {
          pcVar157 = "";
        }
        if (iVar166 == 0) {
          pcVar163 = "same as";
          pcVar159 = "\x1b[0;32m";
          pcVar160 = "";
          pcVar158 = "";
        }
        else {
          pcVar158 = "";
          if (tout[9] != '\0') {
            pcVar158 = "\x1b[1;33m";
          }
          pcVar163 = "different from";
          pcVar159 = "\x1b[0;33m";
          pcVar160 = pcVar157;
        }
        pcVar164 = "";
        if (tout[9] != '\0') {
          pcVar164 = pcVar159;
        }
        Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar158,buffer,
                          pcVar160,pcVar163,pcVar164,pcVar157);
        iVar166 = this->verbose;
      }
    }
  }
  iVar1 = this->veripb;
  if (iVar166 != 0 || iVar1 != 0) {
    snprintf(buffer,0x100,"--veripb=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->veripb == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar158,buffer,pcVar160
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar166 = this->vivify;
  if (iVar166 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar166 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--vivify=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->vivify == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar2 = this->vivifyinst;
  if (iVar2 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar2 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--vivifyinst=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->vivifyinst == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar3 = this->vivifymaxeff;
  if (iVar3 != 20000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifymaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->vivifymaxeff == 20000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e7\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar4 = this->vivifymineff;
  if (iVar4 != 20000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifymineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->vivifymineff == 20000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e4\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar5 = this->vivifyonce;
  if (this->verbose != 0 || iVar5 != 0) {
    snprintf(buffer,0x100,"--vivifyonce=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->vivifyonce == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar158,buffer,pcVar160
                        ,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar6 = this->vivifyredeff;
  if (iVar6 != 0x4b || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifyredeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->vivifyredeff == 0x4b) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'75\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar7 = this->vivifyreleff;
  if (iVar7 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifyreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->vivifyreleff == 0x14) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar8 = this->walk;
  if (iVar8 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar8 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--walk=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->walk == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar9 = this->walkmaxeff;
  if (iVar9 != 10000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--walkmaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->walkmaxeff == 10000000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e7\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar10 = this->walkmineff;
  if (iVar10 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--walkmineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->walkmineff == 100000) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  iVar11 = this->walknonstable;
  if (iVar11 != 1 || this->verbose != 0) {
    pcVar157 = "false";
    if (iVar11 != 0) {
      pcVar157 = "true";
    }
    snprintf(buffer,0x100,"--walknonstable=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->walknonstable == 1) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,"true",pcVar157);
    }
  }
  iVar12 = this->walkredundant;
  if (this->verbose != 0 || iVar12 != 0) {
    pcVar157 = "true";
    if (iVar12 == 0) {
      pcVar157 = "false";
    }
    snprintf(buffer,0x100,"--walkredundant=%s",pcVar157);
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->walkredundant == 0) {
        pcVar163 = "same as";
        pcVar159 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar158 = "";
      }
      else {
        pcVar158 = "";
        if (tout[9] != '\0') {
          pcVar158 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar159 = "\x1b[0;33m";
        pcVar160 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar159;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar158,buffer,
                        pcVar160,pcVar163,pcVar164,"false",pcVar157);
    }
  }
  iVar13 = this->walkreleff;
  if (iVar13 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--walkreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar157 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar157 = "";
      }
      if (this->walkreleff == 0x14) {
        pcVar163 = "same as";
        pcVar158 = "\x1b[0;32m";
        pcVar160 = "";
        pcVar159 = "";
      }
      else {
        pcVar160 = "";
        if (tout[9] != '\0') {
          pcVar160 = "\x1b[1;33m";
        }
        pcVar163 = "different from";
        pcVar158 = "\x1b[0;33m";
        pcVar159 = pcVar157;
      }
      pcVar164 = "";
      if (tout[9] != '\0') {
        pcVar164 = pcVar158;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar160,buffer,
                        pcVar159,pcVar163,pcVar164,pcVar157);
    }
  }
  if (((((iVar162 - (uint)(iVar1 == 0)) + (uint)(iVar166 != 1) + (uint)(iVar2 != 1) +
         (uint)(iVar3 != 20000000) + (uint)(iVar4 != 20000) + 3) - (uint)(iVar5 == 0)) +
       (uint)(iVar6 != 0x4b) + (uint)(iVar7 != 0x14) + (uint)(iVar8 != 1) +
       (uint)(iVar9 != 10000000) + (uint)(iVar10 != 100000) + (uint)(iVar11 != 1) ==
       (uint)(iVar12 == 0) && iVar13 == 0x14) && (this->internal != (Internal *)0x0)) {
    Internal::message(this->internal,"all options are set to their default value");
  }
  return;
}

Assistant:

void Options::print () {
  unsigned different = 0;
#ifdef QUIET
  const bool verbose = false;
#endif
  char buffer[256];
  // We prefer the macro iteration here since '[VLH]' might be '1e9' etc.
#define OPTION(N, V, L, H, O, P, R, D) \
  if (N != (V)) \
    different++; \
  if (verbose || N != (V)) { \
    if ((L) == 0 && (H) == 1) { \
      snprintf (buffer, sizeof buffer, "--" #N "=%s", \
                (N ? "true" : "false")); \
      MSG ("  %s%-30s%s (%s default %s'%s'%s)", \
           ((N == (V)) ? "" : tout.bright_yellow_code ()), buffer, \
           ((N == (V)) ? "" : tout.normal_code ()), \
           ((N == (V)) ? "same as" : "different from"), \
           ((N == (V)) ? tout.green_code () : tout.yellow_code ()), \
           (bool) (V) ? "true" : "false", tout.normal_code ()); \
    } else { \
      snprintf (buffer, sizeof buffer, "--" #N "=%d", N); \
      MSG ("  %s%-30s%s (%s default %s'" #V "'%s)", \
           ((N == (V)) ? "" : tout.bright_yellow_code ()), buffer, \
           ((N == (V)) ? "" : tout.normal_code ()), \
           ((N == (V)) ? "same as" : "different from"), \
           ((N == (V)) ? tout.green_code () : tout.yellow_code ()), \
           tout.normal_code ()); \
    } \
  }
  OPTIONS
#undef OPTION
  if (!different)
    MSG ("all options are set to their default value");
}